

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

void fits_set_region_components(SAORegion *aRgn)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  int *in_RDI;
  bool bVar4;
  int icomp;
  int k;
  int j;
  int i;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
    iVar2 = local_c;
    if (*(char *)(*(long *)(in_RDI + 2) + (long)local_c * 0xa8) == '\0') {
      do {
        iVar1 = iVar2;
        local_10 = iVar1 + -1;
        bVar4 = false;
        if (0 < local_10) {
          bVar4 = *(char *)(*(long *)(in_RDI + 2) + (long)local_10 * 0xa8) == '\0';
        }
        iVar2 = local_10;
      } while (bVar4);
      for (local_10 = iVar1 + -2; -1 < local_10; local_10 = local_10 + -1) {
        if (*(char *)(*(long *)(in_RDI + 2) + (long)local_10 * 0xa8) != '\0') {
          pvVar3 = realloc(*(void **)(in_RDI + 2),(long)(*in_RDI + 1) * 0xa8);
          *(void **)(in_RDI + 2) = pvVar3;
          *in_RDI = *in_RDI + 1;
          iVar2 = *in_RDI;
          while (local_14 = iVar2 + -1, local_10 + 1 < local_14) {
            memcpy((void *)(*(long *)(in_RDI + 2) + (long)local_14 * 0xa8),
                   (void *)(*(long *)(in_RDI + 2) + (long)(iVar2 + -2) * 0xa8),0xa8);
            iVar2 = local_14;
          }
          local_c = local_c + 1;
          memcpy((void *)(*(long *)(in_RDI + 2) + (long)(local_10 + 1) * 0xa8),
                 (void *)(*(long *)(in_RDI + 2) + (long)local_c * 0xa8),0xa8);
        }
      }
    }
  }
  local_18 = 0;
  for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
    if (*(char *)(*(long *)(in_RDI + 2) + (long)local_c * 0xa8) != '\0') {
      local_18 = local_18 + 1;
    }
    *(int *)(*(long *)(in_RDI + 2) + (long)local_c * 0xa8 + 8) = local_18;
  }
  return;
}

Assistant:

void fits_set_region_components ( SAORegion *aRgn )
{
/* 
   Internal routine to turn a collection of regions read from an ascii file into
   the more complex structure that is allowed by the FITS REGION extension with
   multiple components. Regions are anded within components and ored between them
   ie for a pixel to be selected it must be selected by at least one component
   and to be selected by a component it must be selected by all that component's
   shapes.

   The algorithm is to replicate every exclude region after every include
   region before it in the list. eg reg1, reg2, -reg3, reg4, -reg5 becomes
   (reg1, -reg3, -reg5), (reg2, -reg5, -reg3), (reg4, -reg5) where the
   parentheses designate components.
*/

  int i, j, k, icomp;

/* loop round shapes */

  i = 0;
  while ( i<aRgn->nShapes ) {

    /* first do the case of an exclude region */

    if ( !aRgn->Shapes[i].sign ) {

      /* we need to run back through the list copying the current shape as
	 required. start by findin the first include shape before this exclude */

      j = i-1;
      while ( j > 0 && !aRgn->Shapes[j].sign ) j--;

      /* then go back one more shape */

      j--;

      /* and loop back through the regions */

      while ( j >= 0 ) {

	/* if this is an include region then insert a copy of the exclude
	   region immediately after it */
           
        /* Note that this makes shallow copies of a polygon's dynamically
        allocated Pts array -- the memory is shared.  This must be checked
        when freeing in fits_free_region. */

	if ( aRgn->Shapes[j].sign ) {

	  aRgn->Shapes = (RgnShape *) realloc (aRgn->Shapes,(1+aRgn->nShapes)*sizeof(RgnShape));
	  aRgn->nShapes++;
	  for (k=aRgn->nShapes-1; k>j+1; k--) aRgn->Shapes[k] = aRgn->Shapes[k-1];

	  i++;
	  aRgn->Shapes[j+1] = aRgn->Shapes[i];

	}

	j--;

      }

    }

    i++;

  }

  /* now set the component numbers */

  icomp = 0;
  for ( i=0; i<aRgn->nShapes; i++ ) {
    if ( aRgn->Shapes[i].sign ) icomp++;
    aRgn->Shapes[i].comp = icomp;

    /*
    printf("i = %d, shape = %d, sign = %d, comp = %d\n", i, aRgn->Shapes[i].shape, aRgn->Shapes[i].sign, aRgn->Shapes[i].comp);
    */

  }

  return;

}